

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_array_refcount.cpp
# Opt level: O0

void __thiscall
ir_array_refcount_entry::ir_array_refcount_entry(ir_array_refcount_entry *this,ir_variable *var)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  uint local_2c;
  glsl_type *local_20;
  glsl_type *type;
  ir_variable *var_local;
  ir_array_refcount_entry *this_local;
  
  this->var = var;
  this->is_referenced = false;
  uVar3 = glsl_type::arrays_of_arrays_size(var->type);
  if (uVar3 == 0) {
    local_2c = 1;
  }
  else {
    local_2c = glsl_type::arrays_of_arrays_size(var->type);
  }
  this->num_bits = local_2c;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)this->num_bits + 0x1f >> 5;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (uint *)operator_new__(uVar4);
  this->bits = puVar5;
  memset(this->bits,0,((ulong)this->num_bits + 0x1f >> 5) << 2);
  this->array_depth = 0;
  local_20 = var->type;
  while( true ) {
    bVar2 = glsl_type::is_array(local_20);
    if (!bVar2) break;
    this->array_depth = this->array_depth + 1;
    local_20 = (local_20->fields).array;
  }
  return;
}

Assistant:

ir_array_refcount_entry::ir_array_refcount_entry(ir_variable *var)
   : var(var), is_referenced(false)
{
   num_bits = MAX2(1, var->type->arrays_of_arrays_size());
   bits = new BITSET_WORD[BITSET_WORDS(num_bits)];
   memset(bits, 0, BITSET_WORDS(num_bits) * sizeof(bits[0]));

   /* Count the "depth" of the arrays-of-arrays. */
   array_depth = 0;
   for (const glsl_type *type = var->type;
        type->is_array();
        type = type->fields.array) {
      array_depth++;
   }
}